

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pre-process.c
# Opt level: O1

int handle_pragma(dmr_C *C,stream *stream,token **line,token *token)

{
  token *ptVar1;
  token *ptVar2;
  int iVar3;
  
  ptVar1 = *line;
  ptVar2 = token->next;
  if (((((ulong)ptVar2->pos & 0x3f) == 2) && ((ident *)(ptVar2->field_2).number == C->S->once_ident)
      ) && (ptVar2->next == &dmrC_eof_token_entry_)) {
    stream->once = 1;
    iVar3 = 1;
  }
  else {
    token->field_2 = (anon_union_8_7_c7bfca54_for_token_2)C->S->pragma_ident;
    token->pos = (position)((ulong)token->pos & 0xffffffff000fffff | 0x700000);
    *line = token;
    token->next = ptVar1;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int handle_pragma(struct dmr_C *C, struct stream *stream, struct token **line, struct token *token)
{
	struct token *next = *line;

	if (dmrC_match_ident(token->next, C->S->once_ident) && dmrC_eof_token(token->next->next)) {
		stream->once = 1;
		return 1;
	}
	token->ident = C->S->pragma_ident;
	token->pos.newline = 1;
	token->pos.whitespace = 1;
	token->pos.pos = 1;
	*line = token;
	token->next = next;
	return 0;
}